

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O2

LocalSet * __thiscall wasm::Pusher::isPushable(Pusher *this,Expression *curr)

{
  uint i;
  bool bVar1;
  EffectAnalyzer local_180;
  
  if (curr->_id == LocalSetId) {
    i = *(uint *)(curr + 1);
    bVar1 = LocalAnalyzer::isSFA(this->analyzer,i);
    if ((bVar1) &&
       ((this->numGetsSoFar->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_start[i] ==
        (this->analyzer->numGets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start[i])) {
      EffectAnalyzer::EffectAnalyzer
                (&local_180,this->passOptions,this->module,(Expression *)curr[1].type.id);
      bVar1 = EffectAnalyzer::hasUnremovableSideEffects(&local_180);
      EffectAnalyzer::~EffectAnalyzer(&local_180);
      if (!bVar1) {
        return (LocalSet *)curr;
      }
      return (LocalSet *)0x0;
    }
  }
  return (LocalSet *)0x0;
}

Assistant:

LocalSet* isPushable(Expression* curr) {
    auto* set = curr->dynCast<LocalSet>();
    if (!set) {
      return nullptr;
    }
    auto index = set->index;
    // To be pushable, this must be SFA and the right # of gets.
    //
    // It must also not have side effects, as it may no longer execute after it
    // is pushed, since it may be behind a condition that ends up false some of
    // the time. However, removable side effects are ok here. The general
    // problem with removable effects is that we can only remove them, but not
    // move them, because of stuff like this:
    //
    //   if (x != 0) foo(1 / x);
    //
    // If we move 1 / x to execute unconditionally then it may trap, but it
    // would be fine to remove it. This pass does not move code to places where
    // it might execute more, but *less*: we keep the code behind any conditions
    // it was already behind, and potentially put it behind further ones. In
    // effect, we "partially remove" the code, making it not execute some of the
    // time, which is fine.
    if (analyzer.isSFA(index) &&
        numGetsSoFar[index] == analyzer.getNumGets(index) &&
        !EffectAnalyzer(passOptions, module, set->value)
           .hasUnremovableSideEffects()) {
      return set;
    }
    return nullptr;
  }